

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void build_bb_body(dill_stream c,virtual_insn *insn,int i,virtual_insn *insns)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  bit_vec pbVar6;
  long in_RCX;
  dill_stream c_00;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  int fall_through;
  int typ;
  int j;
  branch_table *t;
  basic_block_conflict bb;
  virtual_mach_info vmi;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 local_44;
  int local_3c;
  long *local_30;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0xf0);
  local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
  lVar3 = *(long *)(in_RDI + 8);
  c_00 = (dill_stream)(ulong)(uint)(int)*in_RSI;
  switch(c_00) {
  case (dill_stream)0x0:
  case (dill_stream)0x16:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x1:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x2:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x3:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    break;
  case (dill_stream)0x4:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x5:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    if ((in_RSI[1] & 0x10U) == 0) {
      bb_defines(c_00,(basic_block_conflict)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    else {
      bb_uses(c_00,(basic_block_conflict)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    break;
  case (dill_stream)0x6:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    if ((in_RSI[1] & 0x10U) == 0) {
      bb_defines(c_00,(basic_block_conflict)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    else {
      bb_uses(c_00,(basic_block_conflict)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    break;
  case (dill_stream)0x7:
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x8:
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x9:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0xa:
    break;
  case (dill_stream)0xb:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    *(undefined4 *)((long)local_30 + 0x14) = *(undefined4 *)(in_RSI + 0x10);
    *(undefined4 *)(local_30 + 3) = 1;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    break;
  case (dill_stream)0xc:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    *(undefined4 *)((long)local_30 + 0x14) = *(undefined4 *)(in_RSI + 0xc);
    *(undefined4 *)(local_30 + 3) = 1;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    break;
  case (dill_stream)0xd:
    *(undefined4 *)((long)local_30 + 0x14) = *(undefined4 *)(in_RSI + 0x10);
    *(undefined4 *)(local_30 + 3) = 0;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    break;
  case (dill_stream)0xe:
    break;
  case (dill_stream)0xf:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    break;
  case (dill_stream)0x10:
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    break;
  case (dill_stream)0x11:
    if (-1 < (short)*(undefined4 *)(in_RSI + 8)) {
      bb_uses(c_00,(basic_block_conflict)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    break;
  case (dill_stream)0x12:
    break;
  case (dill_stream)0x13:
    break;
  case (dill_stream)0x14:
    bVar1 = in_RSI[1];
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 1;
    local_30[1] = (long)(in_EDX + -1);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    pvVar5 = dill_realloc(c_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(void **)(lVar2 + 0x10) = pvVar5;
    local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
    *local_30 = (long)in_EDX;
    local_30[1] = -1;
    *(undefined4 *)(local_30 + 2) = 0xffffffff;
    *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
    *(undefined4 *)(local_30 + 3) = 0;
    *(undefined4 *)((long)local_30 + 0x5c) = 0;
    *(undefined4 *)(local_30 + 0xc) = 0;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[7] = (long)pbVar6;
    pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
    local_30[8] = (long)pbVar6;
    if ((bVar1 & 0xf) != 0xb) {
      bb_defines(c_00,(basic_block_conflict)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    break;
  case (dill_stream)0x15:
    bb_uses(c_00,(basic_block_conflict)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            ,0);
    bb_defines(c_00,(basic_block_conflict)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    break;
  case (dill_stream)0x17:
  case (dill_stream)0x18:
  }
  for (local_3c = 0; local_3c < *(int *)(lVar3 + 0x28); local_3c = local_3c + 1) {
    if ((char *)(ulong)*(uint *)(*(long *)(lVar3 + 0x30) + (long)local_3c * 4) ==
        in_RSI + (0x28 - in_RCX)) {
      local_44 = 1;
      iVar4 = (int)*(char *)(in_RCX + (long)(in_EDX + -1) * 0x28);
      if ((iVar4 == 3) || (iVar4 == 10)) {
        local_44 = 0;
      }
      if (*local_30 != (long)in_EDX) {
        *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
        *(undefined4 *)(local_30 + 3) = local_44;
        local_30[1] = (long)(in_EDX + -1);
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        pvVar5 = dill_realloc(c_00,CONCAT44(iVar4,in_stack_ffffffffffffffa8));
        *(void **)(lVar2 + 0x10) = pvVar5;
        local_30 = (long *)(*(long *)(lVar2 + 0x10) + (long)*(int *)(lVar2 + 8) * 0x68);
        *local_30 = (long)in_EDX;
        local_30[1] = -1;
        *(undefined4 *)(local_30 + 2) = 0xffffffff;
        *(undefined4 *)((long)local_30 + 0x14) = 0xffffffff;
        *(undefined4 *)(local_30 + 3) = 0;
        *(undefined4 *)((long)local_30 + 0x5c) = 0;
        *(undefined4 *)(local_30 + 0xc) = 0;
        pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
        local_30[7] = (long)pbVar6;
        pbVar6 = new_bit_vec((int)((ulong)c_00 >> 0x20));
        local_30[8] = (long)pbVar6;
      }
      *(int *)(local_30 + 2) = local_3c;
    }
  }
  return;
}

Assistant:

static void
build_bb_body(dill_stream c, virtual_insn* insn, int i, virtual_insn* insns)
{
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    basic_block bb = &vmi->bblist[vmi->bbcount];
    struct branch_table* t = &c->p->branch_table;
    int j;

    switch (insn->class_code) {
    case iclass_arith3:
    case iclass_compare:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        bb_defines(c, bb, insn->opnds.a3.dest);
        break;
    case iclass_arith3i:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_arith2:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_convert:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_lea:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_loadstorei:
        bb_uses(c, bb, insn->opnds.a3i.src);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3i.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3i.dest);
        }
        break;
    case iclass_loadstore:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3.dest);
        }
        break;
    case iclass_set:
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_setf:
        bb_defines(c, bb, insn->opnds.sf.dest);
        break;
    case iclass_mov:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_reti:
        break;
    case iclass_ret:
        bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_branch:
        bb_uses(c, bb, insn->opnds.br.src1);
        bb_uses(c, bb, insn->opnds.br.src2);
        end_bb(bb, insn->opnds.br.label, 1);
        break;
    case iclass_branchi:
        bb_uses(c, bb, insn->opnds.bri.src);
        end_bb(bb, insn->opnds.bri.label, 1);
        break;
    case iclass_jump_to_label:
        end_bb(bb, insn->opnds.br.label, 0);
        break;
    case iclass_jump_to_reg:
        bb_uses(c, bb, insn->opnds.br.src1);
        end_bb(bb, -1, 0);
        break;
    case iclass_jump_to_imm:
        end_bb(bb, -1, 0);
        break;
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        end_bb(bb, -1, 1);
        /* put the return register definition in the next bb */
        if (typ != DILL_V) {
            bb_defines(c, bb, insn->opnds.calli.src);
        }
        break;
    }
    case iclass_push:
        if ((short)insn->opnds.a1.src >= 0)
            bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_special:
        break;
    case iclass_pushi:
        break;
    case iclass_pushf:
        break;
    case iclass_nop:
    case iclass_mark_label:
        break;
    }
    for (j = 0; j < t->next_label; j++) {
        if ((unsigned)t->label_locs[j] ==
            ((char*)insn - (char*)insns) + sizeof(virtual_insn)) {
            int fall_through = 1;
            switch (insns[i - 1].class_code) {
            case iclass_ret:
            case iclass_reti:
                fall_through = 0;
            default:
                break;
            }
            if (bb->start != i) {
                end_bb(bb, -1, fall_through);
            }
            bb->label = j;
        }
    }
}